

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_list.cpp
# Opt level: O3

double __thiscall ExprEval::Engine::NodeList::calculate(NodeList *this,size_t index)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  NodeType NVar3;
  pointer pNVar4;
  _Alloc_hider _Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  Node node;
  Expression subexpr;
  double local_b0;
  value_type local_a8;
  Expression local_58;
  
  this->m_beg = index;
  this->m_end = index + 1;
  local_b0 = calc(this,index,0);
  NVar3 = (this->m_cache).type;
  pNVar4 = (this->m_nodes).
           super__Vector_base<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>::_M_erase
            (&this->m_nodes,pNVar4 + this->m_beg,pNVar4 + this->m_end);
  if (NVar3 == Expression) {
    (this->m_cache).type = Empty;
    paVar6 = &local_58.m_expression.field_2;
    local_58.m_expression._M_string_length = 0;
    local_58.m_expression.field_2._M_local_buf[0] = '\0';
    local_58.is_calculated = false;
    local_58.m_expression._M_dataplus._M_p = (pointer)paVar6;
    local_b0 = Expression::evaluate(&local_58,&(this->m_cache).expression);
    paVar1 = &local_a8.symbol.field_2;
    local_a8.symbol._M_string_length = 0;
    local_a8.symbol.field_2._M_local_buf[0] = '\0';
    paVar2 = &local_a8.expression.field_2;
    local_a8.expression._M_string_length = 0;
    local_a8.expression.field_2._M_local_buf[0] = '\0';
    local_a8.type = Number;
    local_a8.number = local_b0;
    local_a8.symbol._M_dataplus._M_p = (pointer)paVar1;
    local_a8.expression._M_dataplus._M_p = (pointer)paVar2;
    std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>::insert
              (&this->m_nodes,
               (this->m_nodes).
               super__Vector_base<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>.
               _M_impl.super__Vector_impl_data._M_start + this->m_beg,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.expression._M_dataplus._M_p != paVar2) {
      operator_delete(local_a8.expression._M_dataplus._M_p);
    }
    _Var5._M_p = local_58.m_expression._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.symbol._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8.symbol._M_dataplus._M_p);
      _Var5._M_p = local_58.m_expression._M_dataplus._M_p;
    }
  }
  else {
    paVar6 = &local_a8.symbol.field_2;
    local_a8.symbol._M_string_length = 0;
    local_a8.symbol.field_2._M_local_buf[0] = '\0';
    paVar1 = &local_a8.expression.field_2;
    local_a8.expression._M_string_length = 0;
    local_a8.expression.field_2._M_local_buf[0] = '\0';
    local_a8.type = Number;
    local_a8.number = local_b0;
    local_a8.symbol._M_dataplus._M_p = (pointer)paVar6;
    local_a8.expression._M_dataplus._M_p = (pointer)paVar1;
    std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>::insert
              (&this->m_nodes,
               (this->m_nodes).
               super__Vector_base<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>.
               _M_impl.super__Vector_impl_data._M_start + this->m_beg,&local_a8);
    _Var5._M_p = local_a8.symbol._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.expression._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8.expression._M_dataplus._M_p);
      _Var5._M_p = local_a8.symbol._M_dataplus._M_p;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != paVar6) {
    operator_delete(_Var5._M_p);
  }
  return local_b0;
}

Assistant:

double NodeList::calculate(size_t index){
            // std::cout<<"Index: "<<index<<'\n';
            m_beg = index;
            m_end = index + 1;

            double ans;
            try
            {
                ans = calc(index);
            }
            catch(const Exception& e)
            {
                // std::cerr << e.what() << '\n';
                throw e;
            }
            // std::cout<<"beg: "<<m_beg<<", end: "<<m_end<<'\n';
            if(m_cache.type == NodeType::Expression){
                // std::cout<<"replacing with "<<m_cache.expression<<'\n';
                // std::cout<<" from ["<<m_beg<<", "<<m_end<<"), size: "<<m_nodes.size()<<'\n';
                m_nodes.erase(m_nodes.begin()+m_beg, m_nodes.begin()+m_end);
                m_cache.type = NodeType::Empty;

                ExprEval::Expression subexpr;
                ans = subexpr.evaluate(m_cache.expression);

                Node node;
                node.set(ans);
                m_nodes.insert(m_nodes.begin()+m_beg, node);
                // std::cout<<"replacing with the number: "<<ans<<'\n';
            } else{
                m_nodes.erase(m_nodes.begin()+m_beg, m_nodes.begin()+m_end);
                
                Node node;
                node.set(ans);
                m_nodes.insert(m_nodes.begin()+m_beg, node);
            }
            // std::cout<<"final ans: "<<ans<<'\n';
            return ans;
        }